

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_15::XmlReporter::test_case_start_impl(XmlReporter *this,TestCaseData *in)

{
  XmlWriter *this_00;
  bool bVar1;
  int iVar2;
  char *attribute;
  TestCaseData *file;
  allocator<char> local_cd;
  allocator<char> local_cc;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string local_a0;
  uint local_7c;
  string local_78;
  string local_58;
  string local_38;
  
  if (this->tc != (TestCaseData *)0x0) {
    iVar2 = strcmp(this->tc->m_test_suite,in->m_test_suite);
    if (iVar2 == 0) goto LAB_0010e7d2;
    XmlWriter::endElement(&this->xml);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"TestSuite",(allocator<char> *)&local_a0);
  XmlWriter::startElement(&this->xml,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"name",(allocator<char> *)&local_a0);
  XmlWriter::writeAttribute(&this->xml,&local_c8,in->m_test_suite);
  std::__cxx11::string::~string((string *)&local_c8);
LAB_0010e7d2:
  this->tc = in;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"TestCase",&local_c9);
  this_00 = &this->xml;
  XmlWriter::startElement(this_00,&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"name",&local_ca);
  XmlWriter::writeAttribute(this_00,&local_a0,in->m_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"filename",&local_cb);
  file = in;
  if ((in->m_file).field_0.buf[0x17] < '\0') {
    file = (TestCaseData *)(in->m_file).field_0.data.ptr;
  }
  attribute = skipPathFromFilename((char *)file);
  XmlWriter::writeAttribute(this_00,&local_38,attribute);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"line",&local_cc);
  local_7c = 0;
  if (this->opt->no_line_numbers == false) {
    local_7c = in->m_line;
  }
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_58,&local_7c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"description",&local_cd);
  XmlWriter::writeAttribute(this_00,&local_78,in->m_description);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c8);
  local_c8.field_2._M_allocated_capacity = (size_type)in->m_timeout;
  local_c8._M_dataplus._M_p = (pointer)0x3ee9000000000000;
  local_c8._M_string_length = 0x3ff0000000000000;
  bVar1 = operator!=((Approx *)&local_c8,0.0);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"timeout",(allocator<char> *)&local_a0);
    XmlWriter::writeAttribute<double>(this_00,&local_c8,&in->m_timeout);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if (in->m_may_fail == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"may_fail",(allocator<char> *)&local_a0);
    XmlWriter::writeAttribute(this_00,&local_c8,true);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if (in->m_should_fail == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"should_fail",(allocator<char> *)&local_a0);
    XmlWriter::writeAttribute(this_00,&local_c8,true);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return;
}

Assistant:

void test_case_start_impl(const TestCaseData& in) {
            bool open_ts_tag = false;
            if(tc != nullptr) { // we have already opened a test suite
                if(std::strcmp(tc->m_test_suite, in.m_test_suite) != 0) {
                    xml.endElement();
                    open_ts_tag = true;
                }
            }
            else {
                open_ts_tag = true; // first test case ==> first test suite
            }

            if(open_ts_tag) {
                xml.startElement("TestSuite");
                xml.writeAttribute("name", in.m_test_suite);
            }

            tc = &in;
            xml.startElement("TestCase")
                    .writeAttribute("name", in.m_name)
                    .writeAttribute("filename", skipPathFromFilename(in.m_file.c_str()))
                    .writeAttribute("line", line(in.m_line))
                    .writeAttribute("description", in.m_description);

            if(Approx(in.m_timeout) != 0)
                xml.writeAttribute("timeout", in.m_timeout);
            if(in.m_may_fail)
                xml.writeAttribute("may_fail", true);
            if(in.m_should_fail)
                xml.writeAttribute("should_fail", true);
        }